

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

uint32_t msr_mask(DisasContext_conflict1 *s,int flags,int spsr)

{
  uint32_t uVar1;
  uint local_1c;
  uint32_t mask;
  int spsr_local;
  int flags_local;
  DisasContext_conflict1 *s_local;
  
  local_1c = 0;
  if ((flags & 1U) != 0) {
    local_1c = 0xff;
  }
  if ((flags & 2U) != 0) {
    local_1c = local_1c | 0xff00;
  }
  if ((flags & 4U) != 0) {
    local_1c = local_1c | 0xff0000;
  }
  if ((flags & 8U) != 0) {
    local_1c = local_1c | 0xff000000;
  }
  uVar1 = aarch32_cpsr_valid_mask(s->features,s->isar);
  local_1c = uVar1 & local_1c;
  if (spsr == 0) {
    local_1c = local_1c & 0xf8ef03df;
  }
  if (s->user != 0) {
    local_1c = local_1c & 0xf80f0000;
  }
  return local_1c;
}

Assistant:

static uint32_t msr_mask(DisasContext *s, int flags, int spsr)
{
    uint32_t mask = 0;

    if (flags & (1 << 0)) {
        mask |= 0xff;
    }
    if (flags & (1 << 1)) {
        mask |= 0xff00;
    }
    if (flags & (1 << 2)) {
        mask |= 0xff0000;
    }
    if (flags & (1 << 3)) {
        mask |= 0xff000000;
    }

    /* Mask out undefined and reserved bits.  */
    mask &= aarch32_cpsr_valid_mask(s->features, s->isar);

    /* Mask out execution state.  */
    if (!spsr) {
        mask &= ~CPSR_EXEC;
    }

    /* Mask out privileged bits.  */
    if (IS_USER(s)) {
        mask &= CPSR_USER;
    }
    return mask;
}